

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O0

cmStateSnapshot * __thiscall cmState::Reset(cmStateSnapshot *__return_storage_ptr__,cmState *this)

{
  iterator *piVar1;
  StackIter begin;
  StackIter begin_00;
  StackIter end;
  StackIter end_00;
  bool bVar2;
  pointer this_00;
  PointerType pBVar3;
  PointerType pSVar4;
  string *psVar5;
  PointerType pcVar6;
  iterator iVar7;
  allocator<char> local_601;
  string local_600;
  allocator<char> local_5d9;
  string local_5d8;
  allocator<char> local_5b1;
  string local_5b0;
  allocator<char> local_589;
  string local_588;
  allocator<char> local_561;
  string local_560;
  allocator<char> local_539;
  string local_538;
  allocator<char> local_511;
  string local_510;
  allocator<char> local_4e9;
  string local_4e8;
  allocator<char> local_4c1;
  string local_4c0;
  allocator<char> local_499;
  string local_498;
  allocator<char> local_471;
  string local_470;
  allocator<char> local_449;
  string local_448;
  allocator<char> local_421;
  string local_420;
  allocator<char> local_3f9;
  string local_3f8;
  allocator<char> local_3d1;
  string local_3d0;
  allocator<char> local_3a9;
  string local_3a8;
  allocator<char> local_381;
  string local_380;
  allocator<char> local_359;
  string local_358;
  allocator<char> local_331;
  string local_330;
  allocator<char> local_309;
  string local_308;
  allocator<char> local_2e1;
  string local_2e0;
  allocator<char> local_2b9;
  string local_2b8;
  allocator<char> local_291;
  string local_290;
  allocator<char> local_269;
  string local_268;
  string_view local_248;
  allocator<char> local_231;
  string local_230;
  string_view local_210;
  allocator<char> local_1f9;
  string local_1f8;
  iterator local_1d8;
  iterator local_1c8;
  iterator local_1b8;
  iterator local_1a8;
  cmLinkedTree<cmDefinitions> *local_198;
  PositionType PStack_190;
  cmLinkedTree<cmDefinitions> *local_188;
  PositionType PStack_180;
  allocator<char> local_171;
  string local_170;
  cmValue local_150;
  string local_148 [8];
  string binDir;
  allocator<char> local_e9;
  string local_e8;
  cmValue local_c8;
  string local_c0 [8];
  string srcDir;
  PositionType local_98;
  cmLinkedTree<cmStateDetail::PolicyStackEntry> *local_90;
  PositionType local_88;
  cmLinkedTree<cmStateDetail::PolicyStackEntry> *local_80;
  PositionType local_78;
  undefined1 local_70 [8];
  iterator it;
  undefined1 local_50 [8];
  PositionType pos;
  cmState *this_local;
  
  cmPropertyMap::Clear(&this->GlobalProperties);
  memset(&pos.Position,0,0x30);
  cmPropertyDefinitionMap::cmPropertyDefinitionMap((cmPropertyDefinitionMap *)&pos.Position);
  cmPropertyDefinitionMap::operator=
            (&this->PropertyDefinitions,(cmPropertyDefinitionMap *)&pos.Position);
  cmPropertyDefinitionMap::~cmPropertyDefinitionMap((cmPropertyDefinitionMap *)&pos.Position);
  this_00 = std::
            unique_ptr<cmGlobVerificationManager,_std::default_delete<cmGlobVerificationManager>_>::
            operator->(&this->GlobVerificationManager);
  cmGlobVerificationManager::Reset(this_00);
  _local_50 = cmLinkedTree<cmStateDetail::SnapshotDataType>::Truncate(&this->SnapshotData);
  join_0x00000010_0x00000000_ =
       cmLinkedTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       ::Truncate(&this->ExecutionListFiles);
  _local_70 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::Truncate
                        (&this->BuildsystemDirectory);
  pBVar3 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                     ((iterator *)local_70);
  std::
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::clear(&pBVar3->IncludeDirectories);
  pBVar3 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                     ((iterator *)local_70);
  std::
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::clear(&pBVar3->CompileDefinitions);
  pBVar3 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                     ((iterator *)local_70);
  std::
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::clear(&pBVar3->CompileOptions);
  pBVar3 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                     ((iterator *)local_70);
  std::
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::clear(&pBVar3->LinkOptions);
  pBVar3 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                     ((iterator *)local_70);
  std::
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::clear(&pBVar3->LinkDirectories);
  pBVar3 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                     ((iterator *)local_70);
  (pBVar3->CurrentScope).Tree = (cmLinkedTree<cmStateDetail::SnapshotDataType> *)local_50;
  (pBVar3->CurrentScope).Position = (PositionType)pos.Tree;
  pBVar3 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                     ((iterator *)local_70);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&pBVar3->NormalTargetNames);
  pBVar3 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                     ((iterator *)local_70);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&pBVar3->ImportedTargetNames);
  pBVar3 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                     ((iterator *)local_70);
  cmPropertyMap::Clear(&pBVar3->Properties);
  pBVar3 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                     ((iterator *)local_70);
  std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>::clear(&pBVar3->Children);
  cmLinkedTree<cmStateDetail::PolicyStackEntry>::Clear(&this->PolicyStack);
  iVar7 = cmLinkedTree<cmStateDetail::PolicyStackEntry>::Root(&this->PolicyStack);
  pSVar4 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->((iterator *)local_50)
  ;
  local_80 = iVar7.Tree;
  (pSVar4->Policies).Tree = local_80;
  local_78 = iVar7.Position;
  (pSVar4->Policies).Position = local_78;
  iVar7 = cmLinkedTree<cmStateDetail::PolicyStackEntry>::Root(&this->PolicyStack);
  pSVar4 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->((iterator *)local_50)
  ;
  local_90 = iVar7.Tree;
  (pSVar4->PolicyRoot).Tree = local_90;
  local_88 = iVar7.Position;
  (pSVar4->PolicyRoot).Position = local_88;
  join_0x00000010_0x00000000_ =
       cmLinkedTree<cmStateDetail::PolicyStackEntry>::Root(&this->PolicyStack);
  pSVar4 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->((iterator *)local_50)
  ;
  (pSVar4->PolicyScope).Tree = (cmLinkedTree<cmStateDetail::PolicyStackEntry> *)srcDir.field_2._8_8_
  ;
  (pSVar4->PolicyScope).Position = local_98;
  pSVar4 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->((iterator *)local_50)
  ;
  bVar2 = cmLinkedTree<cmStateDetail::PolicyStackEntry>::iterator::IsValid(&pSVar4->Policies);
  if (!bVar2) {
    __assert_fail("pos->Policies.IsValid()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmState.cxx"
                  ,0x127,"cmStateSnapshot cmState::Reset()");
  }
  pSVar4 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->((iterator *)local_50)
  ;
  bVar2 = cmLinkedTree<cmStateDetail::PolicyStackEntry>::iterator::IsValid(&pSVar4->PolicyRoot);
  if (!bVar2) {
    __assert_fail("pos->PolicyRoot.IsValid()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmState.cxx"
                  ,0x128,"cmStateSnapshot cmState::Reset()");
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"CMAKE_SOURCE_DIR",&local_e9);
  pSVar4 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->((iterator *)local_50)
  ;
  begin_00.Tree = (pSVar4->Vars).Tree;
  begin_00.Position = (pSVar4->Vars).Position;
  pSVar4 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->((iterator *)local_50)
  ;
  piVar1 = &pSVar4->Root;
  binDir.field_2._8_8_ = piVar1->Tree;
  end.Tree = piVar1->Tree;
  end.Position = piVar1->Position;
  local_c8 = cmDefinitions::Get(&local_e8,begin_00,end);
  psVar5 = cmValue::operator*[abi_cxx11_(&local_c8);
  std::__cxx11::string::string(local_c0,(string *)psVar5);
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator(&local_e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_170,"CMAKE_BINARY_DIR",&local_171);
  pSVar4 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->((iterator *)local_50)
  ;
  local_188 = (pSVar4->Vars).Tree;
  PStack_180 = (pSVar4->Vars).Position;
  pSVar4 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->((iterator *)local_50)
  ;
  piVar1 = &pSVar4->Root;
  local_198 = piVar1->Tree;
  PStack_190 = (pSVar4->Root).Position;
  end_00.Tree = piVar1->Tree;
  end_00.Position = piVar1->Position;
  begin.Position = PStack_180;
  begin.Tree = local_188;
  local_150 = cmDefinitions::Get(&local_170,begin,end_00);
  psVar5 = cmValue::operator*[abi_cxx11_(&local_150);
  std::__cxx11::string::string(local_148,(string *)psVar5);
  std::__cxx11::string::~string((string *)&local_170);
  std::allocator<char>::~allocator(&local_171);
  cmLinkedTree<cmDefinitions>::Clear(&this->VarTree);
  local_1b8 = cmLinkedTree<cmDefinitions>::Root(&this->VarTree);
  local_1a8 = cmLinkedTree<cmDefinitions>::Push(&this->VarTree,local_1b8);
  pSVar4 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->((iterator *)local_50)
  ;
  pSVar4->Vars = local_1a8;
  local_1c8 = cmLinkedTree<cmDefinitions>::Root(&this->VarTree);
  pSVar4 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->((iterator *)local_50)
  ;
  pSVar4->Parent = local_1c8;
  local_1d8 = cmLinkedTree<cmDefinitions>::Root(&this->VarTree);
  pSVar4 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->((iterator *)local_50)
  ;
  pSVar4->Root = local_1d8;
  pSVar4 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->((iterator *)local_50)
  ;
  pcVar6 = cmLinkedTree<cmDefinitions>::iterator::operator->(&pSVar4->Vars);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f8,"CMAKE_SOURCE_DIR",&local_1f9);
  local_210 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view(local_c0);
  cmDefinitions::Set(pcVar6,&local_1f8,local_210);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::allocator<char>::~allocator(&local_1f9);
  pSVar4 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->((iterator *)local_50)
  ;
  pcVar6 = cmLinkedTree<cmDefinitions>::iterator::operator->(&pSVar4->Vars);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_230,"CMAKE_BINARY_DIR",&local_231);
  local_248 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view(local_148);
  cmDefinitions::Set(pcVar6,&local_230,local_248);
  std::__cxx11::string::~string((string *)&local_230);
  std::allocator<char>::~allocator(&local_231);
  std::__cxx11::string::~string(local_148);
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_268,"RULE_LAUNCH_COMPILE",&local_269);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_290,"",&local_291);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2b8,"",&local_2b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2e0,"",&local_2e1);
  DefineProperty(this,&local_268,DIRECTORY,&local_290,&local_2b8,true,&local_2e0);
  std::__cxx11::string::~string((string *)&local_2e0);
  std::allocator<char>::~allocator(&local_2e1);
  std::__cxx11::string::~string((string *)&local_2b8);
  std::allocator<char>::~allocator(&local_2b9);
  std::__cxx11::string::~string((string *)&local_290);
  std::allocator<char>::~allocator(&local_291);
  std::__cxx11::string::~string((string *)&local_268);
  std::allocator<char>::~allocator(&local_269);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_308,"RULE_LAUNCH_LINK",&local_309);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_330,"",&local_331);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_358,"",&local_359);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_380,"",&local_381);
  DefineProperty(this,&local_308,DIRECTORY,&local_330,&local_358,true,&local_380);
  std::__cxx11::string::~string((string *)&local_380);
  std::allocator<char>::~allocator(&local_381);
  std::__cxx11::string::~string((string *)&local_358);
  std::allocator<char>::~allocator(&local_359);
  std::__cxx11::string::~string((string *)&local_330);
  std::allocator<char>::~allocator(&local_331);
  std::__cxx11::string::~string((string *)&local_308);
  std::allocator<char>::~allocator(&local_309);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3a8,"RULE_LAUNCH_CUSTOM",&local_3a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3d0,"",&local_3d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3f8,"",&local_3f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_420,"",&local_421);
  DefineProperty(this,&local_3a8,DIRECTORY,&local_3d0,&local_3f8,true,&local_420);
  std::__cxx11::string::~string((string *)&local_420);
  std::allocator<char>::~allocator(&local_421);
  std::__cxx11::string::~string((string *)&local_3f8);
  std::allocator<char>::~allocator(&local_3f9);
  std::__cxx11::string::~string((string *)&local_3d0);
  std::allocator<char>::~allocator(&local_3d1);
  std::__cxx11::string::~string((string *)&local_3a8);
  std::allocator<char>::~allocator(&local_3a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_448,"RULE_LAUNCH_COMPILE",&local_449);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_470,"",&local_471);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_498,"",&local_499);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4c0,"",&local_4c1);
  DefineProperty(this,&local_448,TARGET,&local_470,&local_498,true,&local_4c0);
  std::__cxx11::string::~string((string *)&local_4c0);
  std::allocator<char>::~allocator(&local_4c1);
  std::__cxx11::string::~string((string *)&local_498);
  std::allocator<char>::~allocator(&local_499);
  std::__cxx11::string::~string((string *)&local_470);
  std::allocator<char>::~allocator(&local_471);
  std::__cxx11::string::~string((string *)&local_448);
  std::allocator<char>::~allocator(&local_449);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4e8,"RULE_LAUNCH_LINK",&local_4e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_510,"",&local_511);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_538,"",&local_539);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_560,"",&local_561);
  DefineProperty(this,&local_4e8,TARGET,&local_510,&local_538,true,&local_560);
  std::__cxx11::string::~string((string *)&local_560);
  std::allocator<char>::~allocator(&local_561);
  std::__cxx11::string::~string((string *)&local_538);
  std::allocator<char>::~allocator(&local_539);
  std::__cxx11::string::~string((string *)&local_510);
  std::allocator<char>::~allocator(&local_511);
  std::__cxx11::string::~string((string *)&local_4e8);
  std::allocator<char>::~allocator(&local_4e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_588,"RULE_LAUNCH_CUSTOM",&local_589);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_5b0,"",&local_5b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_5d8,"",&local_5d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_600,"",&local_601);
  DefineProperty(this,&local_588,TARGET,&local_5b0,&local_5d8,true,&local_600);
  std::__cxx11::string::~string((string *)&local_600);
  std::allocator<char>::~allocator(&local_601);
  std::__cxx11::string::~string((string *)&local_5d8);
  std::allocator<char>::~allocator(&local_5d9);
  std::__cxx11::string::~string((string *)&local_5b0);
  std::allocator<char>::~allocator(&local_5b1);
  std::__cxx11::string::~string((string *)&local_588);
  std::allocator<char>::~allocator(&local_589);
  cmStateSnapshot::cmStateSnapshot(__return_storage_ptr__,this,_local_50);
  return __return_storage_ptr__;
}

Assistant:

cmStateSnapshot cmState::Reset()
{
  this->GlobalProperties.Clear();
  this->PropertyDefinitions = {};
  this->GlobVerificationManager->Reset();

  cmStateDetail::PositionType pos = this->SnapshotData.Truncate();
  this->ExecutionListFiles.Truncate();

  {
    cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator it =
      this->BuildsystemDirectory.Truncate();
    it->IncludeDirectories.clear();
    it->CompileDefinitions.clear();
    it->CompileOptions.clear();
    it->LinkOptions.clear();
    it->LinkDirectories.clear();
    it->CurrentScope = pos;
    it->NormalTargetNames.clear();
    it->ImportedTargetNames.clear();
    it->Properties.Clear();
    it->Children.clear();
  }

  this->PolicyStack.Clear();
  pos->Policies = this->PolicyStack.Root();
  pos->PolicyRoot = this->PolicyStack.Root();
  pos->PolicyScope = this->PolicyStack.Root();
  assert(pos->Policies.IsValid());
  assert(pos->PolicyRoot.IsValid());

  {
    std::string srcDir =
      *cmDefinitions::Get("CMAKE_SOURCE_DIR", pos->Vars, pos->Root);
    std::string binDir =
      *cmDefinitions::Get("CMAKE_BINARY_DIR", pos->Vars, pos->Root);
    this->VarTree.Clear();
    pos->Vars = this->VarTree.Push(this->VarTree.Root());
    pos->Parent = this->VarTree.Root();
    pos->Root = this->VarTree.Root();

    pos->Vars->Set("CMAKE_SOURCE_DIR", srcDir);
    pos->Vars->Set("CMAKE_BINARY_DIR", binDir);
  }

  this->DefineProperty("RULE_LAUNCH_COMPILE", cmProperty::DIRECTORY, "", "",
                       true);
  this->DefineProperty("RULE_LAUNCH_LINK", cmProperty::DIRECTORY, "", "",
                       true);
  this->DefineProperty("RULE_LAUNCH_CUSTOM", cmProperty::DIRECTORY, "", "",
                       true);

  this->DefineProperty("RULE_LAUNCH_COMPILE", cmProperty::TARGET, "", "",
                       true);
  this->DefineProperty("RULE_LAUNCH_LINK", cmProperty::TARGET, "", "", true);
  this->DefineProperty("RULE_LAUNCH_CUSTOM", cmProperty::TARGET, "", "", true);

  return { this, pos };
}